

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  ZeroCopyInputStream *pZVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  LogMessage *pLVar5;
  int iVar6;
  uint8 *puVar7;
  int iVar8;
  int buffer_size;
  void *void_buffer;
  LogFinisher local_6d;
  uint local_6c;
  uint8 *local_68;
  LogMessage local_60;
  
  if (*(int *)&this->buffer_end_ != *(int *)&this->buffer_) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x242);
    pLVar5 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (0) == (BufferSize()): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar5);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    pZVar1 = this->input_;
    do {
      iVar3 = (*pZVar1->_vptr_ZeroCopyInputStream[2])(pZVar1,&local_68,&local_6c);
      cVar2 = (char)iVar3;
      if (cVar2 == '\0') {
        this->buffer_ = (uint8 *)0x0;
        this->buffer_end_ = (uint8 *)0x0;
        return false;
      }
    } while ((long)(int)local_6c == 0);
    this->buffer_ = local_68;
    this->buffer_end_ = local_68 + (int)local_6c;
    if ((int)local_6c < 0) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,599);
      pLVar5 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (buffer_size) >= (0): ");
      internal::LogFinisher::operator=(&local_6d,pLVar5);
      internal::LogMessage::~LogMessage(&local_60);
    }
    iVar3 = this->total_bytes_read_;
    iVar8 = iVar3 - (local_6c ^ 0x7fffffff);
    if (iVar8 == 0 || iVar3 < (int)(local_6c ^ 0x7fffffff)) {
      iVar3 = local_6c + iVar3;
      puVar7 = this->buffer_end_;
    }
    else {
      this->overflow_bytes_ = iVar8;
      puVar7 = this->buffer_end_ + -(long)iVar8;
      this->buffer_end_ = puVar7;
      iVar3 = 0x7fffffff;
    }
    this->total_bytes_read_ = iVar3;
    this->buffer_end_ = puVar7 + this->buffer_size_after_limit_;
    iVar8 = this->current_limit_;
    if (this->total_bytes_limit_ < this->current_limit_) {
      iVar8 = this->total_bytes_limit_;
    }
    iVar4 = iVar3 - iVar8;
    iVar6 = 0;
    if (iVar4 != 0 && iVar8 <= iVar3) {
      this->buffer_end_ = puVar7 + this->buffer_size_after_limit_ + -(long)iVar4;
      iVar6 = iVar4;
    }
    this->buffer_size_after_limit_ = iVar6;
  }
  else {
    cVar2 = '\0';
    if ((this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_) &&
       (cVar2 = '\0', this->total_bytes_limit_ != this->current_limit_)) {
      PrintTotalBytesLimitError(this);
      cVar2 = '\0';
    }
  }
  return (bool)cVar2;
}

Assistant:

bool CodedInputStream::Refresh() {
  GOOGLE_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    GOOGLE_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}